

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::QuantileDiscFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  LogicalType local_480;
  LogicalType local_468;
  LogicalType local_450;
  LogicalType local_438;
  LogicalType local_420;
  LogicalType local_408;
  LogicalType local_3f0;
  LogicalType local_3d8;
  string local_3c0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  ::std::__cxx11::string::string((string *)&local_3c0,"quantile_disc",(allocator *)&local_480);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  LogicalType::LogicalType(&local_3d8,ANY);
  LogicalType::LogicalType(&local_3f0,ANY);
  LogicalType::LogicalType(&local_480,DOUBLE);
  EmptyQuantileFunction<duckdb::DiscreteQuantileFunction>
            (&local_140,&local_3d8,&local_3f0,&local_480);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  LogicalType::~LogicalType(&local_480);
  LogicalType::~LogicalType(&local_3f0);
  LogicalType::~LogicalType(&local_3d8);
  LogicalType::LogicalType(&local_408,ANY);
  LogicalType::LogicalType(&local_420,ANY);
  LogicalType::LogicalType(&local_438,DOUBLE);
  LogicalType::LIST(&local_480,&local_438);
  EmptyQuantileFunction<duckdb::DiscreteQuantileListFunction>
            (&local_270,&local_408,&local_420,&local_480);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  LogicalType::~LogicalType(&local_480);
  LogicalType::~LogicalType(&local_438);
  LogicalType::~LogicalType(&local_420);
  LogicalType::~LogicalType(&local_408);
  LogicalType::LogicalType(&local_450,ANY);
  LogicalType::LogicalType(&local_468,ANY);
  LogicalType::LogicalType(&local_480,INVALID);
  EmptyQuantileFunction<duckdb::DiscreteQuantileFunction>
            (&local_3a0,&local_450,&local_468,&local_480);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  LogicalType::~LogicalType(&local_480);
  LogicalType::~LogicalType(&local_468);
  LogicalType::~LogicalType(&local_450);
  return in_RDI;
}

Assistant:

AggregateFunctionSet QuantileDiscFun::GetFunctions() {
	AggregateFunctionSet set("quantile_disc");
	set.AddFunction(
	    EmptyQuantileFunction<DiscreteQuantileFunction>(LogicalType::ANY, LogicalType::ANY, LogicalType::DOUBLE));
	set.AddFunction(EmptyQuantileFunction<DiscreteQuantileListFunction>(LogicalType::ANY, LogicalType::ANY,
	                                                                    LogicalType::LIST(LogicalType::DOUBLE)));
	// this function is here for deserialization - it cannot be called by users
	set.AddFunction(
	    EmptyQuantileFunction<DiscreteQuantileFunction>(LogicalType::ANY, LogicalType::ANY, LogicalType::INVALID));
	return set;
}